

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

int cs_impl::fiber::resume(routine_t id)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  void *pvVar5;
  long *in_FS_OFFSET;
  
  lVar2 = *in_FS_OFFSET;
  if (*(char *)(lVar2 + -8) == '\0') {
    *(undefined1 *)(lVar2 + -8) = 1;
    __cxx_global_var_init_7();
  }
  if (*(int *)(lVar2 + -0x3e0) == 0) {
    if (*(char *)(lVar2 + -8) == '\0') {
      *(undefined1 *)(lVar2 + -8) = 1;
      __cxx_global_var_init_7();
    }
    lVar3 = *(long *)(*(long *)(lVar2 + -0x410) + (ulong)(id - 1) * 8);
    if (lVar3 == 0) {
      iVar4 = -1;
    }
    else {
      iVar4 = -2;
      if (*(char *)(lVar3 + 0x68) == '\0') {
        if (*(long *)(lVar3 + 0x60) == 0) {
          lVar1 = lVar3 + 0x70;
          getcontext(lVar1);
          if (*(char *)(lVar2 + -8) == '\0') {
            *(undefined1 *)(lVar2 + -8) = 1;
            __cxx_global_var_init_7();
          }
          pvVar5 = operator_new__(*(ulong *)(lVar2 + -0x3d8));
          *(void **)(lVar3 + 0x60) = pvVar5;
          *(void **)(lVar3 + 0x80) = pvVar5;
          if (*(char *)(lVar2 + -8) == '\0') {
            *(undefined1 *)(lVar2 + -8) = 1;
            __cxx_global_var_init_7();
          }
          *(undefined8 *)(lVar3 + 0x90) = *(undefined8 *)(lVar2 + -0x3d8);
          if (*(char *)(lVar2 + -8) == '\0') {
            *(undefined1 *)(lVar2 + -8) = 1;
            __cxx_global_var_init_7();
          }
          *(long *)(lVar3 + 0x78) = lVar2 + -0x3d0;
          if (*(char *)(lVar2 + -8) == '\0') {
            *(undefined1 *)(lVar2 + -8) = 1;
            __cxx_global_var_init_7();
          }
          *(routine_t *)(lVar2 + -0x3e0) = id;
          makecontext(lVar1,entry,0);
          cs::current_process = *(undefined **)(lVar3 + 8);
          **(long **)(*(long *)(**(long **)(lVar3 + 0x38) + 0x10) + 0x110) = lVar3 + 0x10;
          if (*(char *)(lVar2 + -8) == '\0') {
            *(undefined1 *)(lVar2 + -8) = 1;
            __cxx_global_var_init_7();
          }
          swapcontext(lVar2 + -0x3d0,lVar1);
          iVar4 = 0;
        }
        else {
          if (*(char *)(lVar2 + -8) == '\0') {
            *(undefined1 *)(lVar2 + -8) = 1;
            __cxx_global_var_init_7();
          }
          *(routine_t *)(lVar2 + -0x3e0) = id;
          cs::current_process = *(undefined **)(lVar3 + 8);
          **(long **)(*(long *)(**(long **)(lVar3 + 0x38) + 0x10) + 0x110) = lVar3 + 0x10;
          if (*(char *)(lVar2 + -8) == '\0') {
            *(undefined1 *)(lVar2 + -8) = 1;
            __cxx_global_var_init_7();
          }
          swapcontext(lVar2 + -0x3d0,lVar3 + 0x70);
          iVar4 = 0;
        }
      }
    }
    return iVar4;
  }
  __assert_fail("ordinator.current == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                ,0x157,"int cs_impl::fiber::resume(routine_t)");
}

Assistant:

int resume(routine_t id)
		{
			assert(ordinator.current == 0);

			Routine *routine = ordinator.routines[id - 1];
			if (routine == nullptr)
				return -1;

			if (routine->finished)
				return -2;

			if (routine->stack == nullptr) {
				//initializes the structure to the currently active context.
				//When successful, getcontext() returns 0
				//On error, return -1 and set errno appropriately.
				cs_fiber_getcontext(&routine->ctx);

				//Before invoking makecontext(), the caller must allocate a new stack
				//for this context and assign its address to ucp->uc_stack,
				//and define a successor context and assign its address to ucp->uc_link.
				routine->stack = new char[ordinator.stack_size];
				routine->ctx.uc_stack.ss_sp = routine->stack;
				routine->ctx.uc_stack.ss_size = ordinator.stack_size;
				routine->ctx.uc_link = &ordinator.ctx;
				ordinator.current = id;

				//When this context is later activated by swapcontext(), the function entry is called.
				//When this function returns, the  successor context is activated.
				//If the successor context pointer is NULL, the thread exits.
				cs_fiber_makecontext(&routine->ctx, reinterpret_cast<void (*)(void)>(entry), 0);

				//The swapcontext() function saves the current context,
				//and then activates the context of another.
				cs::current_process = routine->cs_pcontext.get();
				routine->cs_context->instance->swap_context(&routine->cs_stack);
				cs_fiber_swapcontext(&ordinator.ctx, &routine->ctx);
			}
			else {
				ordinator.current = id;
				cs::current_process = routine->cs_pcontext.get();
				routine->cs_context->instance->swap_context(&routine->cs_stack);
				cs_fiber_swapcontext(&ordinator.ctx, &routine->ctx);
			}

			return 0;
		}